

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Array<unsigned_char>_>::grow
          (Vector<kj::Array<unsigned_char>_> *this,size_t minCapacity)

{
  Array<unsigned_char> *pAVar1;
  Array<unsigned_char> *pAVar2;
  ulong uVar3;
  
  pAVar1 = (this->builder).endPtr;
  pAVar2 = (this->builder).ptr;
  uVar3 = 4;
  if (pAVar1 != pAVar2) {
    uVar3 = (((long)pAVar1 - (long)pAVar2) / 0x18) * 2;
  }
  if (minCapacity <= uVar3) {
    minCapacity = uVar3;
  }
  setCapacity(this,minCapacity);
  return;
}

Assistant:

inline size_t capacity() const { return endPtr - ptr; }